

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

EndOfGameType __thiscall hanabi_learning_env::HanabiState::EndOfGameStatus(HanabiState *this)

{
  int iVar1;
  EndOfGameType EVar2;
  
  if (0 < this->life_tokens_) {
    iVar1 = Score(this);
    if (iVar1 < this->parent_game_->num_ranks_ * this->parent_game_->num_colors_) {
      EVar2 = (uint)(this->turns_to_play_ < 1) * 2;
    }
    else {
      EVar2 = kCompletedFireworks;
    }
    return EVar2;
  }
  return kOutOfLifeTokens;
}

Assistant:

HanabiState::EndOfGameType HanabiState::EndOfGameStatus() const {
  if (LifeTokens() < 1) {
    return kOutOfLifeTokens;
  }
  if (Score() >= ParentGame()->NumColors() * ParentGame()->NumRanks()) {
    return kCompletedFireworks;
  }
  if (turns_to_play_ <= 0) {
    return kOutOfCards;
  }
  return kNotFinished;
}